

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O0

int_least64_t anon_unknown.dwarf_5987e::tick_factor(void)

{
  undefined1 auVar1 [16];
  long lVar2;
  
  if (tick_factor::tick_factor == 0) {
    lVar2 = sysconf(2);
    if (lVar2 < 1) {
      tick_factor::tick_factor = -1;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = SUB168(SEXT816(1000000000),8);
      tick_factor::tick_factor = SUB168((auVar1 << 0x40 | ZEXT816(1000000000)) / SEXT816(lVar2),0);
      if (tick_factor::tick_factor == 0) {
        tick_factor::tick_factor = -1;
      }
    }
  }
  return tick_factor::tick_factor;
}

Assistant:

std::int_least64_t tick_factor()  // multiplier to convert ticks
                                  //  to nanoseconds; -1 if unknown
{
  static std::int_least64_t tick_factor = 0;
  if (tick_factor == 0) {
    if (tick_factor = ::sysconf(_SC_CLK_TCK); tick_factor <= 0) {
      tick_factor = -1;
    } else {
      tick_factor = INT64_C(1000000000) / tick_factor;  // compute factor
      if (tick_factor == 0) {
        tick_factor = -1;
      }
    }
  }
  return tick_factor;
}